

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cted_tree_index_impl.h
# Opt level: O2

double __thiscall
ted_ub::CTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSCTED>::ted
          (CTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSCTED>
           *this,TreeIndexSCTED *t1,TreeIndexSCTED *t2)

{
  size_type columns;
  longlong *plVar1;
  Matrix<double> *this_00;
  Matrix<double> *this_01;
  double dVar2;
  double dVar3;
  int iVar4;
  long lVar5;
  pointer pvVar6;
  uint uVar7;
  double *pdVar8;
  pointer pdVar9;
  pointer pdVar10;
  pointer pvVar11;
  int iVar12;
  Matrix<double> *this_02;
  size_t sVar13;
  uint uVar14;
  size_t sVar15;
  ulong col;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  allocator_type local_d1;
  long local_d0;
  ulong local_c8;
  size_t local_c0;
  double local_b8;
  undefined8 uStack_b0;
  double local_a8;
  undefined8 uStack_a0;
  size_t local_98;
  size_t local_90;
  ulong local_88;
  vector<double,_std::allocator<double>_> df2;
  vector<double,_std::allocator<double>_> dt2;
  
  (this->super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSCTED>).
  subproblem_counter_ = 0;
  local_90 = (size_t)(t1->super_Constants).tree_size_;
  local_98 = (size_t)(t2->super_Constants).tree_size_;
  sVar15 = local_90 + 1;
  columns = local_98 + 1;
  data_structures::Matrix<double>::Matrix((Matrix<double> *)&dt2,sVar15,columns);
  this_00 = &this->dt_;
  data_structures::Matrix<double>::operator=(this_00,(Matrix<double> *)&dt2);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)
             &dt2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  data_structures::Matrix<double>::Matrix((Matrix<double> *)&dt2,sVar15,columns);
  this_01 = &this->df_;
  data_structures::Matrix<double>::operator=(this_01,(Matrix<double> *)&dt2);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)
             &dt2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  data_structures::Matrix<double>::Matrix((Matrix<double> *)&dt2,sVar15,columns);
  this_02 = &this->e_;
  data_structures::Matrix<double>::operator=(this_02,(Matrix<double> *)&dt2);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)
             &dt2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  data_structures::Matrix<double>::fill_with(this_00,INFINITY);
  data_structures::Matrix<double>::fill_with(this_01,INFINITY);
  data_structures::Matrix<double>::fill_with(this_02,INFINITY);
  std::vector<double,_std::allocator<double>_>::vector(&dt2,columns,(allocator_type *)&df2);
  std::vector<double,_std::allocator<double>_>::vector(&df2,columns,&local_d1);
  pdVar8 = data_structures::Matrix<double>::at(this_00,0,0);
  *pdVar8 = 0.0;
  pdVar8 = data_structures::Matrix<double>::at(this_01,0,0);
  *pdVar8 = 0.0;
  iVar12 = 0;
  if (0 < (int)local_90) {
    iVar12 = (int)local_90;
  }
  local_c0 = (size_t)(iVar12 + 1);
  for (sVar15 = 1; sVar15 != local_c0; sVar15 = sVar15 + 1) {
    pdVar8 = data_structures::Matrix<double>::at(this_01,sVar15,0);
    *pdVar8 = 0.0;
    uVar7 = 0;
    while( true ) {
      pvVar11 = (t1->super_PostLToChildren).postl_to_children_.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = *(long *)&pvVar11[sVar15 - 1].super__Vector_base<int,_std::allocator<int>_>._M_impl;
      if ((ulong)((long)*(pointer *)
                         ((long)&pvVar11[sVar15 - 1].super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl + 8) - lVar5 >> 2) < (ulong)(uVar7 + 1)) break;
      pdVar8 = data_structures::Matrix<double>::at
                         (this_00,(long)*(int *)(lVar5 + (ulong)uVar7 * 4) + 1,0);
      dVar19 = *pdVar8;
      pdVar8 = data_structures::Matrix<double>::at(this_01,sVar15,0);
      *pdVar8 = dVar19 + *pdVar8;
      uVar7 = uVar7 + 1;
    }
    pdVar8 = data_structures::Matrix<double>::at(this_01,sVar15,0);
    dVar19 = *pdVar8;
    pdVar8 = data_structures::Matrix<double>::at(this_00,sVar15,0);
    *pdVar8 = dVar19 + 1.0;
  }
  iVar12 = 0;
  if (0 < (int)local_98) {
    iVar12 = (int)local_98;
  }
  local_88 = (ulong)(iVar12 + 1);
  for (sVar15 = 1; sVar15 != local_88; sVar15 = sVar15 + 1) {
    pdVar8 = data_structures::Matrix<double>::at(this_01,0,sVar15);
    *pdVar8 = 0.0;
    uVar7 = 0;
    while( true ) {
      pvVar11 = (t2->super_PostLToChildren).postl_to_children_.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = *(long *)&pvVar11[sVar15 - 1].super__Vector_base<int,_std::allocator<int>_>._M_impl;
      if ((ulong)((long)*(pointer *)
                         ((long)&pvVar11[sVar15 - 1].super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl + 8) - lVar5 >> 2) < (ulong)(uVar7 + 1)) break;
      pdVar8 = data_structures::Matrix<double>::at
                         (this_00,0,(long)*(int *)(lVar5 + (ulong)uVar7 * 4) + 1);
      dVar19 = *pdVar8;
      pdVar8 = data_structures::Matrix<double>::at(this_01,0,sVar15);
      *pdVar8 = dVar19 + *pdVar8;
      uVar7 = uVar7 + 1;
    }
    pdVar8 = data_structures::Matrix<double>::at(this_01,0,sVar15);
    dVar19 = *pdVar8;
    pdVar8 = data_structures::Matrix<double>::at(this_00,0,sVar15);
    *pdVar8 = dVar19 + 1.0;
  }
  sVar13 = local_c0;
  for (sVar15 = 1;
      pdVar9 = dt2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start, sVar15 != sVar13; sVar15 = sVar15 + 1) {
    for (; pdVar10 = df2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
        pdVar9 != dt2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish; pdVar9 = pdVar9 + 1) {
      *pdVar9 = INFINITY;
    }
    for (; pdVar10 !=
           df2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish; pdVar10 = pdVar10 + 1) {
      *pdVar10 = INFINITY;
    }
    local_d0 = (sVar15 - 1) * 0x18;
    for (uVar17 = 1; uVar17 != local_88; uVar17 = uVar17 + 1) {
      pdVar8 = data_structures::Matrix<double>::at(this_02,0,0);
      *pdVar8 = 0.0;
      uVar7 = 0;
      while( true ) {
        uVar14 = uVar7 + 1;
        pvVar11 = (t1->super_PostLToChildren).postl_to_children_.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)(*(long *)((long)&(pvVar11->super__Vector_base<int,_std::allocator<int>_>).
                                     _M_impl + local_d0 + 8) -
                    *(long *)((long)&(pvVar11->super__Vector_base<int,_std::allocator<int>_>).
                                     _M_impl + local_d0) >> 2) < (ulong)uVar14) break;
        pdVar8 = data_structures::Matrix<double>::at(this_02,(ulong)uVar7,0);
        dVar19 = *pdVar8;
        pdVar8 = data_structures::Matrix<double>::at
                           (this_00,(long)*(int *)(*(long *)((long)&(((t1->super_PostLToChildren).
                                                                      postl_to_children_.
                                                                                                                                            
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl + local_d0) + (ulong)uVar7 * 4) + 1,0);
        dVar2 = *pdVar8;
        pdVar8 = data_structures::Matrix<double>::at(this_02,(ulong)uVar14,0);
        *pdVar8 = dVar19 + dVar2;
        uVar7 = uVar14;
      }
      lVar5 = uVar17 - 1;
      uVar7 = 0;
      local_c8 = uVar17;
      while( true ) {
        uVar14 = uVar7 + 1;
        pvVar11 = (t2->super_PostLToChildren).postl_to_children_.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)*(pointer *)
                           ((long)&pvVar11[lVar5].super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl + 8) -
                    *(long *)&pvVar11[lVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl
                   >> 2) < (ulong)uVar14) break;
        pdVar8 = data_structures::Matrix<double>::at(this_02,0,(ulong)uVar7);
        dVar19 = *pdVar8;
        pdVar8 = data_structures::Matrix<double>::at
                           (this_00,0,
                            (long)*(int *)(*(long *)&(t2->super_PostLToChildren).postl_to_children_.
                                                                                                          
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar5].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + (ulong)uVar7 * 4) + 1);
        dVar2 = *pdVar8;
        pdVar8 = data_structures::Matrix<double>::at(this_02,0,(ulong)uVar14);
        *pdVar8 = dVar19 + dVar2;
        uVar7 = uVar14;
      }
      for (uVar17 = 1; uVar18 = local_c8,
          pvVar6 = (t1->super_PostLToChildren).postl_to_children_.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          uVar17 <= (ulong)(*(long *)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)
                                             ._M_impl + local_d0 + 8) -
                            *(long *)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)
                                             ._M_impl + local_d0) >> 2);
          uVar17 = (ulong)((int)uVar17 + 1)) {
        uVar18 = (ulong)((int)uVar17 - 1);
        uVar7 = 0;
        while( true ) {
          uVar16 = (ulong)(uVar7 + 1);
          if ((ulong)((long)*(pointer *)
                             ((long)&pvVar11[lVar5].super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl + 8) -
                      *(long *)&pvVar11[lVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl
                     >> 2) < uVar16) break;
          plVar1 = &(this->
                    super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSCTED>
                    ).subproblem_counter_;
          *plVar1 = *plVar1 + 1;
          col = (ulong)uVar7;
          pdVar8 = data_structures::Matrix<double>::at(this_02,uVar17,col);
          dVar19 = *pdVar8;
          pdVar8 = data_structures::Matrix<double>::at
                             (this_00,0,
                              (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                       postl_to_children_.
                                                                                                              
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar5].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + col * 4) + 1);
          dVar2 = *pdVar8;
          pdVar8 = data_structures::Matrix<double>::at(this_02,uVar18,uVar16);
          dVar3 = *pdVar8;
          pdVar8 = data_structures::Matrix<double>::at
                             (this_00,(long)*(int *)(*(long *)((long)&(((t1->super_PostLToChildren).
                                                                        postl_to_children_.
                                                                                                                                                
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl + local_d0) + uVar18 * 4) + 1,0);
          dVar20 = *pdVar8;
          pdVar8 = data_structures::Matrix<double>::at(this_02,uVar18,col);
          local_a8 = *pdVar8;
          uStack_a0 = 0;
          pdVar8 = data_structures::Matrix<double>::at
                             (this_00,(long)*(int *)(*(long *)((long)&(((t1->super_PostLToChildren).
                                                                        postl_to_children_.
                                                                                                                                                
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl + local_d0) + uVar18 * 4) + 1,
                              (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                       postl_to_children_.
                                                                                                              
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar5].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + col * 4) + 1);
          local_b8 = *pdVar8;
          pdVar8 = data_structures::Matrix<double>::at(this_02,uVar17,uVar16);
          uVar16 = -(ulong)(dVar3 + dVar20 <= dVar19 + dVar2);
          dVar19 = (double)(~uVar16 & (ulong)(dVar19 + dVar2) | (ulong)(dVar3 + dVar20) & uVar16);
          uVar16 = -(ulong)(local_a8 + local_b8 <= dVar19);
          *pdVar8 = (double)(uVar16 & (ulong)(local_a8 + local_b8) | ~uVar16 & (ulong)dVar19);
          pvVar11 = (t2->super_PostLToChildren).postl_to_children_.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar7 = uVar7 + 1;
        }
        sVar13 = local_c0;
      }
      pdVar8 = data_structures::Matrix<double>::at(this_01,0,local_c8);
      dVar19 = *pdVar8;
      dVar2 = df2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar18];
      pdVar8 = data_structures::Matrix<double>::at(this_01,sVar15,0);
      dVar3 = *pdVar8;
      pdVar8 = data_structures::Matrix<double>::at(this_01,sVar15,uVar18);
      local_a8 = *pdVar8;
      pvVar11 = (t1->super_PostLToChildren).postl_to_children_.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar6 = (t2->super_PostLToChildren).postl_to_children_.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar8 = data_structures::Matrix<double>::at
                         (this_02,*(long *)((long)&(pvVar11->
                                                   super__Vector_base<int,_std::allocator<int>_>).
                                                   _M_impl + local_d0 + 8) -
                                  *(long *)((long)&(pvVar11->
                                                   super__Vector_base<int,_std::allocator<int>_>).
                                                   _M_impl + local_d0) >> 2,
                          (long)*(pointer *)
                                 ((long)&pvVar6[lVar5].super__Vector_base<int,_std::allocator<int>_>
                                         ._M_impl + 8) -
                          *(long *)&pvVar6[lVar5].super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl >> 2);
      local_b8 = *pdVar8;
      uStack_b0 = 0;
      pdVar8 = data_structures::Matrix<double>::at(this_01,sVar15,uVar18);
      uVar17 = -(ulong)(dVar3 + local_a8 <= dVar19 + dVar2);
      dVar19 = (double)(~uVar17 & (ulong)(dVar19 + dVar2) | (ulong)(dVar3 + local_a8) & uVar17);
      uVar17 = -(ulong)(local_b8 <= dVar19);
      *pdVar8 = (double)(uVar17 & (ulong)local_b8 | ~uVar17 & (ulong)dVar19);
      pdVar8 = data_structures::Matrix<double>::at(this_00,0,uVar18);
      dVar19 = *pdVar8;
      dVar2 = dt2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar18];
      pdVar8 = data_structures::Matrix<double>::at(this_00,sVar15,0);
      dVar3 = *pdVar8;
      pdVar8 = data_structures::Matrix<double>::at(this_00,sVar15,uVar18);
      local_a8 = *pdVar8;
      pdVar8 = data_structures::Matrix<double>::at(this_01,sVar15,uVar18);
      local_b8 = *pdVar8;
      uStack_b0 = 0;
      iVar12 = (t1->super_PostLToLabelId).postl_to_label_id_.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[sVar15 - 1];
      iVar4 = (t2->super_PostLToLabelId).postl_to_label_id_.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [uVar18 - 1];
      pdVar8 = data_structures::Matrix<double>::at(this_00,sVar15,uVar18);
      uVar17 = local_c8;
      dVar20 = 0.0;
      if (iVar12 != iVar4) {
        dVar20 = 1.0;
      }
      uVar18 = -(ulong)(dVar3 + local_a8 <= dVar19 + dVar2);
      dVar19 = (double)(~uVar18 & (ulong)(dVar19 + dVar2) | (ulong)(dVar3 + local_a8) & uVar18);
      uVar18 = -(ulong)(local_b8 + dVar20 <= dVar19);
      *pdVar8 = (double)(uVar18 & (ulong)(local_b8 + dVar20) | ~uVar18 & (ulong)dVar19);
      if (-1 < (t2->super_PostLToParent).postl_to_parent_.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[local_c8 - 1]) {
        pdVar8 = data_structures::Matrix<double>::at(this_01,sVar15,local_c8);
        dVar19 = *pdVar8;
        pdVar8 = data_structures::Matrix<double>::at(this_01,0,uVar17);
        if (dVar19 - *pdVar8 <
            df2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[(long)(t2->super_PostLToParent).postl_to_parent_.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar17 - 1] + 1]) {
          pdVar8 = data_structures::Matrix<double>::at(this_01,sVar15,uVar17);
          dVar19 = *pdVar8;
          pdVar8 = data_structures::Matrix<double>::at(this_01,0,uVar17);
          df2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[(long)(t2->super_PostLToParent).postl_to_parent_.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar17 - 1] + 1] = dVar19 - *pdVar8;
        }
        pdVar8 = data_structures::Matrix<double>::at(this_00,sVar15,uVar17);
        dVar19 = *pdVar8;
        pdVar8 = data_structures::Matrix<double>::at(this_00,0,uVar17);
        if (dVar19 - *pdVar8 <
            dt2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[(long)(t2->super_PostLToParent).postl_to_parent_.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar17 - 1] + 1]) {
          pdVar8 = data_structures::Matrix<double>::at(this_00,sVar15,uVar17);
          dVar19 = *pdVar8;
          pdVar8 = data_structures::Matrix<double>::at(this_00,0,uVar17);
          dt2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[(long)(t2->super_PostLToParent).postl_to_parent_.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar17 - 1] + 1] = dVar19 - *pdVar8;
        }
      }
      if (-1 < (t1->super_PostLToParent).postl_to_parent_.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[sVar15 - 1]) {
        pdVar8 = data_structures::Matrix<double>::at(this_01,sVar15,uVar17);
        dVar19 = *pdVar8;
        pdVar8 = data_structures::Matrix<double>::at(this_01,sVar15,0);
        dVar2 = *pdVar8;
        pdVar8 = data_structures::Matrix<double>::at
                           (this_01,(long)(t1->super_PostLToParent).postl_to_parent_.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start[sVar15 - 1] + 1,uVar17);
        uVar17 = local_c8;
        if (dVar19 - dVar2 < *pdVar8) {
          pdVar8 = data_structures::Matrix<double>::at(this_01,sVar15,local_c8);
          dVar19 = *pdVar8;
          pdVar8 = data_structures::Matrix<double>::at(this_01,sVar15,0);
          dVar2 = *pdVar8;
          pdVar8 = data_structures::Matrix<double>::at
                             (this_01,(long)(t1->super_PostLToParent).postl_to_parent_.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start[sVar15 - 1] + 1,uVar17)
          ;
          *pdVar8 = dVar19 - dVar2;
        }
        uVar17 = local_c8;
        pdVar8 = data_structures::Matrix<double>::at(this_00,sVar15,local_c8);
        dVar19 = *pdVar8;
        pdVar8 = data_structures::Matrix<double>::at(this_00,sVar15,0);
        dVar2 = *pdVar8;
        pdVar8 = data_structures::Matrix<double>::at
                           (this_00,(long)(t1->super_PostLToParent).postl_to_parent_.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start[sVar15 - 1] + 1,uVar17);
        if (dVar19 - dVar2 < *pdVar8) {
          pdVar8 = data_structures::Matrix<double>::at(this_00,sVar15,uVar17);
          dVar19 = *pdVar8;
          pdVar8 = data_structures::Matrix<double>::at(this_00,sVar15,0);
          dVar2 = *pdVar8;
          pdVar8 = data_structures::Matrix<double>::at
                             (this_00,(long)(t1->super_PostLToParent).postl_to_parent_.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start[sVar15 - 1] + 1,uVar17)
          ;
          *pdVar8 = dVar19 - dVar2;
        }
      }
    }
  }
  pdVar8 = data_structures::Matrix<double>::at(this_00,local_90,local_98);
  dVar19 = *pdVar8;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&df2.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&dt2.super__Vector_base<double,_std::allocator<double>_>);
  return dVar19;
}

Assistant:

double CTEDTreeIndex<CostModel, TreeIndex>::ted(const TreeIndex& t1, const TreeIndex& t2) {

  // Reset subproblem counter.
  subproblem_counter_ = 0;
  
  int t1_input_size = t1.tree_size_;
  int t2_input_size = t2.tree_size_;
  
  // Initialise distance matrices.
  
  // TODO: Verify if a move assignment operator is used here.
  dt_ = data_structures::Matrix<double>(t1_input_size+1, t2_input_size+1);
  df_ = data_structures::Matrix<double>(t1_input_size+1, t2_input_size+1);
  e_ = data_structures::Matrix<double>(t1_input_size+1, t2_input_size+1);
  
  // Fill the matrices with inf.
  dt_.fill_with(std::numeric_limits<double>::infinity());
  df_.fill_with(std::numeric_limits<double>::infinity());
  e_.fill_with(std::numeric_limits<double>::infinity());
  
  std::vector<double> dt2(t2_input_size + 1);
  std::vector<double> df2(t2_input_size + 1);
  
  double a = -1;
  double b = -1;
  double c = -1;
  
  dt_.at(0, 0) = 0;
  df_.at(0, 0) = 0;
  for (int i = 1; i <= t1_input_size; ++i) {
    df_.at(i, 0) = 0;
    for (unsigned int k = 1; k <= t1.postl_to_children_[i-1].size(); ++k) {
      df_.at(i, 0) += dt_.at(t1.postl_to_children_[i-1][k-1] + 1, 0);
    }
    dt_.at(i, 0) = df_.at(i, 0) + c_.del(t1.postl_to_label_id_[i - 1]);
  }
  for (int j = 1; j <= t2_input_size; ++j) {
    df_.at(0, j) = 0;
    for (unsigned int k = 1; k <= t2.postl_to_children_[j-1].size(); ++k) {
      df_.at(0, j) += dt_.at(0, t2.postl_to_children_[j-1][k-1] + 1);
    }
    dt_.at(0, j) = df_.at(0, j) + c_.ins(t2.postl_to_label_id_[j - 1]);
  }
  
  for (int i = 1; i <= t1_input_size; ++i) {
    std::fill(dt2.begin(), dt2.end(), std::numeric_limits<double>::infinity());
    std::fill(df2.begin(), df2.end(), std::numeric_limits<double>::infinity());
    
    for (int j = 1; j <= t2_input_size; ++j) {
      e_.at(0, 0) = 0;
      for (unsigned int s = 1; s <= t1.postl_to_children_[i-1].size(); ++s) {
        e_.at(s, 0) = e_.at(s-1, 0) + dt_.at(t1.postl_to_children_[i-1][s-1] + 1, 0); // here we access d for subtree rooted in the s'th child of node i AND s starts with 1 but the postorder of the first child of node i is children1[i][s-1]
      }
      for (unsigned int t = 1; t <= t2.postl_to_children_[j-1].size(); ++t) {
        e_.at(0, t) = e_.at(0, t-1) + dt_.at(0, t2.postl_to_children_[j-1][t-1] + 1);
      }
      
      // TODO: but we already went over each pair of children
      for (unsigned int s = 1; s <= t1.postl_to_children_[i-1].size(); ++s) {
        for (unsigned int t = 1; t <= t2.postl_to_children_[j-1].size(); ++t) {
          ++subproblem_counter_;
          a = e_.at(s, t-1) + dt_.at(0, t2.postl_to_children_[j-1][t-1] + 1);
          b = e_.at(s-1, t) + dt_.at(t1.postl_to_children_[i-1][s-1] + 1, 0);
          c = e_.at(s-1, t-1) + dt_.at(t1.postl_to_children_[i-1][s-1] + 1, t2.postl_to_children_[j-1][t-1] + 1); // TODO: This is a problematic part to reduce the memory. This requires to store distance for each pair of children of i and j.
          e_.at(s, t) = a >= b ? b >= c ? c : b : a >= c ? c : a;
        }
      }
      
      a = df_.at(0, j) + df2[j];
      b = df_.at(i, 0) + df_.at(i, j);
      c = e_.at(t1.postl_to_children_[i-1].size(), t2.postl_to_children_[j-1].size());
      
      df_.at(i, j) = a >= b ? b >= c ? c : b : a >= c ? c : a;
      
      a = dt_.at(0, j) + dt2[j];
      b = dt_.at(i, 0) + dt_.at(i, j);
      c = df_.at(i, j) + c_.ren(t1.postl_to_label_id_[i - 1], t2.postl_to_label_id_[j - 1]);
      
      dt_.at(i, j) = a >= b ? b >= c ? c : b : a >= c ? c : a;
      
      if (t2.postl_to_parent_[j-1] > -1) {
        if (df_.at(i, j) - df_.at(0, j) < df2[t2.postl_to_parent_[j-1]+1]) {
          df2[t2.postl_to_parent_[j-1]+1] = df_.at(i, j) - df_.at(0, j);
        }
        if (dt_.at(i, j) - dt_.at(0, j) < dt2[t2.postl_to_parent_[j-1]+1]) {
          dt2[t2.postl_to_parent_[j-1]+1] = dt_.at(i, j) - dt_.at(0, j);
        }
      }
      if (t1.postl_to_parent_[i-1] > -1) {
        if (df_.at(i, j) - df_.at(i, 0) < df_.at(t1.postl_to_parent_[i-1]+1, j)) {
          df_.at(t1.postl_to_parent_[i-1]+1, j) = df_.at(i, j) - df_.at(i, 0);
        }
        if (dt_.at(i, j) - dt_.at(i, 0) < dt_.at(t1.postl_to_parent_[i-1]+1, j)) {
          dt_.at(t1.postl_to_parent_[i-1]+1, j) = dt_.at(i, j) - dt_.at(i, 0);
        }
      }
    }
  }

  return dt_.at(t1_input_size, t2_input_size);
}